

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

CppTypeName * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::cppFullName
          (CppTypeName *__return_storage_ptr__,CapnpcCppMain *this,Schema schema,Schema brand,
          Maybe<capnp::InterfaceSchema::Method> *method)

{
  Reader proto;
  Reader brand_00;
  Reader proto_00;
  Reader proto_01;
  StringPtr innerName;
  ArrayPtr<const_char> AVar1;
  Schema schema_00;
  CapnpcCppMain *brand_01;
  bool bVar2;
  uint uVar4;
  uint64_t uVar5;
  NullableValue<capnp::schema::Value::Reader> *pNVar6;
  Reader *pRVar7;
  bool bVar3;
  uint64_t uVar8;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar9;
  Reader RVar10;
  ArrayPtr<const_char> AVar11;
  Iterator IVar12;
  ArrayPtr<const_char> AVar13;
  Iterator IVar14;
  StringPtr SVar15;
  StringPtr name;
  char *local_650;
  anon_class_24_3_b107c969 local_5e8;
  Range<unsigned_int> local_5d0;
  Mapper<kj::Range<unsigned_int>_> local_5c8;
  Array<capnp::(anonymous_namespace)::CppTypeName> local_5c0;
  ArrayDisposer *local_5a8;
  char *pcStack_5a0;
  uint local_58c;
  undefined1 local_588 [4];
  uint paramCount;
  BrandArgumentList args;
  Reader params;
  Fault local_4e0;
  Fault f_1;
  char *local_4d0;
  String local_480;
  Reader local_468;
  undefined1 auStack_438 [8];
  Reader field;
  undefined1 local_3f8 [8];
  Iterator __end6;
  undefined1 local_3d8 [8];
  Iterator __begin6;
  Reader local_398;
  Reader *local_368;
  Reader *__range6;
  size_t local_358;
  undefined1 local_350 [8];
  Reader nested;
  undefined1 local_310 [8];
  Iterator __end4;
  undefined1 local_2f0 [8];
  Iterator __begin4;
  Reader *__range4;
  Reader parentProto;
  Maybe<capnp::schema::Value::Reader> local_238;
  undefined1 local_200 [8];
  NullableValue<capnp::schema::Value::Reader> annotatedName;
  String ownUnqualifiedName;
  StringPtr unqualifiedName;
  Reader local_198;
  Schema local_168;
  Schema parent;
  Maybe<capnp::schema::Value::Reader> local_100;
  undefined1 local_c8 [8];
  NullableValue<capnp::schema::Value::Reader> ns;
  uint64_t local_80 [3];
  Fault local_68;
  Fault f;
  Reader node;
  Maybe<capnp::InterfaceSchema::Method> *method_local;
  CapnpcCppMain *this_local;
  Schema brand_local;
  Schema schema_local;
  CppTypeName *result;
  
  this_local = (CapnpcCppMain *)brand.raw;
  brand_local = schema;
  Schema::getProto((Reader *)&f,&brand_local);
  uVar5 = capnp::schema::Node::Reader::getScopeId((Reader *)&f);
  if (uVar5 == 0) {
    bVar2 = capnp::schema::Node::Reader::isFile((Reader *)&f);
    if (!bVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[72]>
                (&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                 ,0x174,FAILED,"node.isFile()",
                 "\"Non-file had scopeId zero; perhaps it\'s a method param / result struct?\"",
                 (char (*) [72])
                 "Non-file had scopeId zero; perhaps it\'s a method param / result struct?");
      kj::_::Debug::Fault::fatal(&local_68);
    }
    local_80[0] = capnp::schema::Node::Reader::getId((Reader *)&f);
    pVar9 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert(&this->usedImports,local_80);
    ns.field_1._40_8_ = pVar9.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    proto._reader.capTable = (CapTableReader *)node._reader.segment;
    proto._reader.segment = (SegmentReader *)f.exception;
    proto._reader.data = node._reader.capTable;
    proto._reader.pointers = (WirePointer *)node._reader.data;
    proto._reader._32_8_ = node._reader.pointers;
    proto._reader._40_8_ = node._reader._32_8_;
    annotationValue<capnp::schema::Node::Reader>(&local_100,this,proto,0xb9c6f99ebf805f2c);
    pNVar6 = kj::_::readMaybe<capnp::schema::Value::Reader>(&local_100);
    kj::_::NullableValue<capnp::schema::Value::Reader>::NullableValue
              ((NullableValue<capnp::schema::Value::Reader> *)local_c8,pNVar6);
    kj::Maybe<capnp::schema::Value::Reader>::~Maybe(&local_100);
    pRVar7 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_c8);
    if (pRVar7 == (Reader *)0x0) {
      CppTypeName::makeRoot();
    }
    else {
      pRVar7 = kj::_::NullableValue<capnp::schema::Value::Reader>::operator->
                         ((NullableValue<capnp::schema::Value::Reader> *)local_c8);
      RVar10 = capnp::schema::Value::Reader::getText(pRVar7);
      name.content.ptr = RVar10.super_StringPtr.content.size_;
      name.content.size_ = (size_t)RVar10.super_StringPtr.content.ptr;
      CppTypeName::makeNamespace(__return_storage_ptr__,RVar10.super_StringPtr.content.ptr,name);
    }
    parent.raw._4_4_ = 1;
    kj::_::NullableValue<capnp::schema::Value::Reader>::~NullableValue
              ((NullableValue<capnp::schema::Value::Reader> *)local_c8);
  }
  else {
    uVar5 = capnp::schema::Node::Reader::getScopeId((Reader *)&f);
    local_198._reader.dataSize = 0;
    local_198._reader.pointerCount = 0;
    local_198._reader._38_2_ = 0;
    local_198._reader.nestingLimit = 0;
    local_198._reader._44_4_ = 0;
    local_198._reader.data = (void *)0x0;
    local_198._reader.pointers = (WirePointer *)0x0;
    local_198._reader.segment = (SegmentReader *)0x0;
    local_198._reader.capTable = (CapTableReader *)0x0;
    capnp::schema::Brand::Reader::Reader(&local_198);
    Schema::Schema((Schema *)&unqualifiedName.content.size_);
    brand_00._reader.capTable = local_198._reader.capTable;
    brand_00._reader.segment = local_198._reader.segment;
    brand_00._reader.data = local_198._reader.data;
    brand_00._reader.pointers = local_198._reader.pointers;
    brand_00._reader.dataSize = local_198._reader.dataSize;
    brand_00._reader.pointerCount = local_198._reader.pointerCount;
    brand_00._reader._38_2_ = local_198._reader._38_2_;
    brand_00._reader.nestingLimit = local_198._reader.nestingLimit;
    brand_00._reader._44_4_ = local_198._reader._44_4_;
    local_168 = SchemaLoader::get(&this->schemaLoader,uVar5,brand_00,
                                  (Schema)unqualifiedName.content.size_);
    kj::StringPtr::StringPtr((StringPtr *)&ownUnqualifiedName.content.disposer);
    kj::String::String((String *)&annotatedName.field_1.value._reader.nestingLimit);
    proto_00._reader.capTable = (CapTableReader *)node._reader.segment;
    proto_00._reader.segment = (SegmentReader *)f.exception;
    proto_00._reader.data = node._reader.capTable;
    proto_00._reader.pointers = (WirePointer *)node._reader.data;
    proto_00._reader._32_8_ = node._reader.pointers;
    proto_00._reader._40_8_ = node._reader._32_8_;
    annotationValue<capnp::schema::Node::Reader>(&local_238,this,proto_00,0xf264a779fef191ce);
    pNVar6 = kj::_::readMaybe<capnp::schema::Value::Reader>(&local_238);
    kj::_::NullableValue<capnp::schema::Value::Reader>::NullableValue
              ((NullableValue<capnp::schema::Value::Reader> *)local_200,pNVar6);
    kj::Maybe<capnp::schema::Value::Reader>::~Maybe(&local_238);
    pRVar7 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_200);
    if (pRVar7 == (Reader *)0x0) {
      Schema::getProto((Reader *)&__range4,&local_168);
      capnp::schema::Node::Reader::getNestedNodes((Reader *)&__begin4.index,(Reader *)&__range4);
      IVar12 = List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader::begin
                         ((Reader *)&__begin4.index);
      __end4._8_8_ = IVar12.container;
      __begin4.container._0_4_ = IVar12.index;
      local_2f0 = (undefined1  [8])__end4._8_8_;
      IVar12 = List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader::end
                         ((Reader *)&__begin4.index);
      nested._reader._40_8_ = IVar12.container;
      __end4.container._0_4_ = IVar12.index;
      local_310 = (undefined1  [8])nested._reader._40_8_;
      while( true ) {
        bVar2 = _::
                IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                              *)local_2f0,
                             (IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                              *)local_310);
        AVar1.size_ = (size_t)unqualifiedName.content.ptr;
        AVar1.ptr = (char *)ownUnqualifiedName.content.disposer;
        AVar13.size_ = local_358;
        AVar13.ptr = (char *)__range6;
        if (!bVar2) break;
        _::
        IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
        ::operator*((Reader *)local_350,
                    (IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                     *)local_2f0);
        uVar5 = capnp::schema::Node::NestedNode::Reader::getId((Reader *)local_350);
        uVar8 = capnp::schema::Node::Reader::getId((Reader *)&f);
        if (uVar5 == uVar8) {
          AVar13 = (ArrayPtr<const_char>)
                   capnp::schema::Node::NestedNode::Reader::getName((Reader *)local_350);
          AVar1 = AVar13;
          break;
        }
        _::
        IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
        ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Node::NestedNode,_(capnp::Kind)3>::Reader,_capnp::schema::Node::NestedNode::Reader>
                      *)local_2f0);
      }
      unqualifiedName.content.ptr = (char *)AVar1.size_;
      ownUnqualifiedName.content.disposer = (ArrayDisposer *)AVar1.ptr;
      local_358 = AVar13.size_;
      __range6 = (Reader *)AVar13.ptr;
      bVar2 = kj::StringPtr::operator==
                        ((StringPtr *)&ownUnqualifiedName.content.disposer,(void *)0x0);
      if ((bVar2) && (bVar2 = capnp::schema::Node::Reader::isStruct((Reader *)&__range4), bVar2)) {
        capnp::schema::Node::Reader::getStruct((Reader *)&__begin6.index,(Reader *)&__range4);
        capnp::schema::Node::Struct::Reader::getFields(&local_398,(Reader *)&__begin6.index);
        local_368 = &local_398;
        IVar14 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::begin(local_368);
        __end6._8_8_ = IVar14.container;
        __begin6.container._0_4_ = IVar14.index;
        local_3d8 = (undefined1  [8])__end6._8_8_;
        IVar14 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::end(local_368);
        field._reader._40_8_ = IVar14.container;
        __end6.container._0_4_ = IVar14.index;
        local_3f8 = (undefined1  [8])field._reader._40_8_;
        while (bVar2 = _::
                       IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                       ::operator!=((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                     *)local_3d8,
                                    (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                     *)local_3f8), bVar2) {
          _::
          IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
          ::operator*((Reader *)auStack_438,
                      (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                       *)local_3d8);
          bVar3 = capnp::schema::Field::Reader::isGroup((Reader *)auStack_438);
          bVar2 = false;
          if (bVar3) {
            capnp::schema::Field::Reader::getGroup(&local_468,(Reader *)auStack_438);
            uVar5 = capnp::schema::Field::Group::Reader::getTypeId(&local_468);
            uVar8 = capnp::schema::Node::Reader::getId((Reader *)&f);
            bVar2 = uVar5 == uVar8;
          }
          if (bVar2) {
            proto_01._reader.capTable = (CapTableReader *)field._reader.segment;
            proto_01._reader.segment = (SegmentReader *)auStack_438;
            proto_01._reader.data = field._reader.capTable;
            proto_01._reader.pointers = (WirePointer *)field._reader.data;
            proto_01._reader._32_8_ = field._reader.pointers;
            proto_01._reader.nestingLimit = field._reader.dataSize;
            proto_01._reader._44_2_ = field._reader.pointerCount;
            proto_01._reader._46_2_ = field._reader._38_2_;
            SVar15 = protoName<capnp::schema::Field::Reader>(this,proto_01);
            toTitleCase(&local_480,this,SVar15);
            kj::String::operator=
                      ((String *)&annotatedName.field_1.value._reader.nestingLimit,&local_480);
            kj::String::~String(&local_480);
            kj::StringPtr::StringPtr
                      ((StringPtr *)&f_1,(String *)&annotatedName.field_1.value._reader.nestingLimit
                      );
            ownUnqualifiedName.content.disposer = (ArrayDisposer *)f_1.exception;
            unqualifiedName.content.ptr = local_4d0;
            break;
          }
          _::
          IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
          ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                        *)local_3d8);
        }
      }
      bVar2 = kj::StringPtr::operator!=
                        ((StringPtr *)&ownUnqualifiedName.content.disposer,(void *)0x0);
      AVar11.size_ = (size_t)unqualifiedName.content.ptr;
      AVar11.ptr = local_650;
      if (!bVar2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                  (&local_4e0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                   ,0x19b,FAILED,"unqualifiedName != nullptr",
                   "\"A schema Node\'s supposed scope did not contain the node as a NestedNode.\"",
                   (char (*) [73])
                   "A schema Node\'s supposed scope did not contain the node as a NestedNode.");
        kj::_::Debug::Fault::fatal(&local_4e0);
      }
    }
    else {
      pRVar7 = kj::_::NullableValue<capnp::schema::Value::Reader>::operator->
                         ((NullableValue<capnp::schema::Value::Reader> *)local_200);
      AVar11 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText(pRVar7);
      parentProto._reader._40_8_ = AVar11.ptr;
      ownUnqualifiedName.content.disposer = (ArrayDisposer *)parentProto._reader._40_8_;
    }
    unqualifiedName.content.ptr = (char *)AVar11.size_;
    kj::_::NullableValue<capnp::schema::Value::Reader>::~NullableValue
              ((NullableValue<capnp::schema::Value::Reader> *)local_200);
    brand_01 = this_local;
    schema_00.raw = local_168.raw;
    kj::Maybe<capnp::InterfaceSchema::Method>::Maybe
              ((Maybe<capnp::InterfaceSchema::Method> *)&params.reader.nestingLimit,method);
    cppFullName(__return_storage_ptr__,this,schema_00,(Schema)brand_01,
                (Maybe<capnp::InterfaceSchema::Method> *)&params.reader.nestingLimit);
    kj::Maybe<capnp::InterfaceSchema::Method>::~Maybe
              ((Maybe<capnp::InterfaceSchema::Method> *)&params.reader.nestingLimit);
    capnp::schema::Node::Reader::getParameters((Reader *)&args.bindings,(Reader *)&f);
    uVar4 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size
                      ((Reader *)&args.bindings);
    if (uVar4 == 0) {
      SVar15.content.size_ = (size_t)unqualifiedName.content.ptr;
      SVar15.content.ptr = (char *)ownUnqualifiedName.content.disposer;
      CppTypeName::addMemberType(__return_storage_ptr__,SVar15);
    }
    else {
      uVar5 = capnp::schema::Node::Reader::getId((Reader *)&f);
      Schema::getBrandArgumentsAtScope((BrandArgumentList *)local_588,(Schema *)&this_local,uVar5);
      local_58c = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size
                            ((Reader *)&args.bindings);
      local_5a8 = ownUnqualifiedName.content.disposer;
      pcStack_5a0 = unqualifiedName.content.ptr;
      local_5d0 = kj::range<unsigned_int>(0,local_58c);
      kj::_::Mapper<kj::Range<unsigned_int>_>::Mapper(&local_5c8,&local_5d0);
      local_5e8.args = (BrandArgumentList *)local_588;
      local_5e8.this = this;
      local_5e8.method = method;
      kj::_::Mapper<kj::Range<unsigned_int>_>::
      operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_c___c__:439:13)>
                (&local_5c0,&local_5c8,&local_5e8);
      innerName.content.size_ = (size_t)pcStack_5a0;
      innerName.content.ptr = (char *)local_5a8;
      CppTypeName::addMemberTemplate(__return_storage_ptr__,innerName,&local_5c0);
      kj::Array<capnp::(anonymous_namespace)::CppTypeName>::~Array(&local_5c0);
    }
    parent.raw._4_4_ = 1;
    kj::String::~String((String *)&annotatedName.field_1.value._reader.nestingLimit);
  }
  return __return_storage_ptr__;
}

Assistant:

CppTypeName cppFullName(Schema schema, Schema brand, kj::Maybe<InterfaceSchema::Method> method) {
    auto node = schema.getProto();

    if (node.getScopeId() == 0) {
      // This is the file-level scope. Search for the namespace annotation.
      KJ_REQUIRE(node.isFile(),
          "Non-file had scopeId zero; perhaps it's a method param / result struct?");
      usedImports.insert(node.getId());
      KJ_IF_MAYBE(ns, annotationValue(node, NAMESPACE_ANNOTATION_ID)) {
        return CppTypeName::makeNamespace(ns->getText());
      } else {
        return CppTypeName::makeRoot();
      }
    }